

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-perm.c
# Opt level: O1

int borg_perma_aux(int what)

{
  borg_grid *pbVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = 0;
  switch(what) {
  case 0:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 3 + L'\a';
    }
    if (((!borg.temp.fast) && (_Var2 = borg_spell_okay_fail(HASTE_SELF,wVar3), _Var2)) &&
       ((wVar4 = borg_get_spell_power(HASTE_SELF),
        wVar4 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) &&
        (iVar6 = 5, borg_simulate == false)))) {
      _Var2 = borg_spell_fail(HASTE_SELF,wVar3);
      iVar6 = 0;
      if (_Var2) {
        borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
        iVar6 = 5;
      }
    }
    break;
  case 1:
    if (borg.temp.prot_from_evil) {
      return 0;
    }
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    _Var2 = borg_spell_okay_fail(PROTECTION_FROM_EVIL,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar4 = borg_get_spell_power(PROTECTION_FROM_EVIL);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar4) {
      return 0;
    }
    if (borg_simulate != false) {
      return 3;
    }
    _Var2 = borg_spell_fail(PROTECTION_FROM_EVIL,wVar3);
    if (!_Var2) {
      return 0;
    }
    borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
    goto LAB_00216f07;
  case 2:
    wVar3 = L'\x19';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x0f';
    }
    if (((((!borg.temp.bless) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
        ((_Var2 = borg_spell_okay_fail(BLESS,wVar3), _Var2 &&
         ((wVar3 = borg_get_spell_power(BLESS), borg.trait[0x23] < 0xb ||
          (iVar6 = 0, wVar3 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7)))))))
       && (iVar6 = 1, borg_simulate == false)) {
      borg_spell(BLESS);
      borg.no_rest_prep = 10000;
    }
    break;
  case 3:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (2 < (byte)(borg.temp.res_acid + borg.temp.res_fire + borg.temp.res_elec + borg.temp.res_cold
                  )) {
      return 0;
    }
    _Var2 = borg_spell_okay_fail(RESISTANCE,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar4 = borg_get_spell_power(RESISTANCE);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar4) {
      return 0;
    }
    if (borg_simulate != false) {
      return 2;
    }
    borg_spell_fail(RESISTANCE,wVar3);
    goto LAB_00216d73;
  case 4:
    if (2 < (byte)(borg.temp.res_acid + borg.temp.res_fire + borg.temp.res_pois + borg.temp.res_elec
                  + borg.temp.res_cold)) {
      return 0;
    }
    if (borg_fighting_unique == L'\0') {
      return 0;
    }
    _Var2 = borg_equips_item(act_resist_all,true);
    if ((!_Var2) && (_Var2 = borg_equips_item(act_rage_bless_resist,true), !_Var2)) {
      return 0;
    }
    if (borg_simulate != false) {
      return 2;
    }
    _Var2 = borg_activate_item(act_resist_all);
    if ((!_Var2) && (_Var2 = borg_activate_item(act_rage_bless_resist), !_Var2)) {
      return 2;
    }
LAB_00216d73:
    iVar6 = 2;
    borg.no_rest_prep = 21000;
    break;
  case 5:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (unique_on_level == 0 || borg.temp.res_pois) {
      return 0;
    }
    _Var2 = borg_spell_okay_fail(RESIST_POISON,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar4 = borg_get_spell_power(RESIST_POISON);
    if (borg.trait[0x1e] / 0x14 <= wVar4) {
      return 0;
    }
    if (borg_simulate != false) {
      return 1;
    }
    _Var2 = borg_spell_fail(RESIST_POISON,wVar3);
    if (!_Var2) {
      return 0;
    }
    borg.no_rest_prep = 21000;
    goto LAB_00216beb;
  case 6:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (borg.temp.fastcast) {
      return 0;
    }
    if (borg.trait[0x70] != 0) {
      return 0;
    }
    if (borg.trait[0x72] != 0) {
      return 0;
    }
    _Var2 = borg_spell_okay_fail(MANA_CHANNEL,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar3 = borg_get_spell_power(MANA_CHANNEL);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar3) {
      return 0;
    }
    if (borg_simulate != false) {
      return 5;
    }
    _Var2 = borg_spell(MANA_CHANNEL);
    goto LAB_00216fca;
  case 7:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (borg.temp.hero) {
      return 0;
    }
    if (borg.trait[0x70] != 0) {
      return 0;
    }
    if (borg.trait[0x72] != 0) {
      return 0;
    }
    wVar4 = borg.trait[0x23];
    wVar5 = borg_heroism_level();
    if (wVar4 <= wVar5) {
      return 0;
    }
    _Var2 = borg_spell_okay_fail(HEROISM,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar3 = borg_get_spell_power(HEROISM);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar3) {
      return 0;
    }
    if (borg_simulate == false) {
      _Var2 = borg_spell(HEROISM);
      if (!_Var2) {
        return 0;
      }
      borg.no_rest_prep = 3000;
    }
    goto LAB_00216beb;
  case 8:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if ((((!borg.temp.berserk) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       ((_Var2 = borg_spell_okay_fail(BERSERK_STRENGTH,wVar3), _Var2 &&
        (wVar3 = borg_get_spell_power(BERSERK_STRENGTH),
        wVar3 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7))))) {
      if (borg_simulate == false) {
        _Var2 = borg_spell(BERSERK_STRENGTH);
        if (!_Var2) {
          return 0;
        }
        borg.no_rest_prep = 11000;
      }
      iVar6 = 2;
    }
    break;
  case 9:
    if (((borg_fighting_unique != L'\0') && (!borg.temp.hero)) &&
       ((!borg.temp.berserk &&
        ((wVar3 = borg_slot(L'\x1a',sv_potion_berserk), wVar3 != L'\xffffffff' &&
         (iVar6 = 2, borg_simulate == false)))))) {
      _Var2 = borg_quaff_potion(sv_potion_berserk);
      iVar6 = (uint)_Var2 * 2;
    }
    break;
  case 10:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (borg.temp.smite_evil) {
      return 0;
    }
    if (borg.trait[0xc2] != 0) {
      return 0;
    }
    if (borg.trait[0x70] != 0) {
      return 0;
    }
    if (borg.trait[0x72] != 0) {
      return 0;
    }
    _Var2 = borg_spell_okay_fail(SMITE_EVIL,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar3 = borg_get_spell_power(SMITE_EVIL);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar3) {
      return 0;
    }
    if (borg_simulate == false) {
      _Var2 = borg_spell(SMITE_EVIL);
      if (!_Var2) {
        return 0;
      }
      borg.no_rest_prep = 21000;
    }
    goto LAB_00216f07;
  case 0xb:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (borg.temp.venom) {
      return 0;
    }
    if (borg.trait[0xd1] != 0) {
      return 0;
    }
    if (borg.trait[0x70] != 0) {
      return 0;
    }
    if (borg.trait[0x72] != 0) {
      return 0;
    }
    _Var2 = borg_spell_okay_fail(VENOM,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar3 = borg_get_spell_power(SMITE_EVIL);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar3) {
      return 0;
    }
    if (borg_simulate == false) {
      _Var2 = borg_spell(VENOM);
      if (!_Var2) {
        return 0;
      }
      borg.no_rest_prep = 19000;
    }
LAB_00216f07:
    iVar6 = 3;
    break;
  case 0xc:
    wVar3 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar3 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (borg.temp.regen) {
      return 0;
    }
    if (borg.trait[0x70] != 0) {
      return 0;
    }
    if (borg.trait[0x72] != 0) {
      return 0;
    }
    if (borg.trait[0x79] != 0) {
      return 0;
    }
    if (borg.trait[0x1c] < 100) {
      return 0;
    }
    _Var2 = borg_spell_okay_fail(RAPID_REGENERATION,wVar3);
    if (!_Var2) {
      return 0;
    }
    wVar3 = borg_get_spell_power(RAPID_REGENERATION);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar3) {
      return 0;
    }
    _Var2 = borg_spell(RAPID_REGENERATION);
LAB_00216fca:
    if (_Var2 == false) {
      return 0;
    }
    borg.no_rest_prep = 6000;
LAB_00216beb:
    iVar6 = 1;
    break;
  case 0xe:
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x33] == 0)) &&
       (borg.see_inv == 0)) {
      pbVar1 = borg_grids[borg.c.y];
      lVar7 = (long)borg.c.x;
      _Var2 = borg_spell_okay_fail(SENSE_INVISIBLE,L'\x19');
      if ((_Var2) && (((pbVar1[lVar7].info & 2) != 0 || (borg.trait[0x1a] != 0)))) {
        if (borg_simulate == false) {
          _Var2 = borg_spell_fail(SENSE_INVISIBLE,L'\x19');
          if (!_Var2) {
            return 0;
          }
          borg.see_inv = 32000;
          borg.no_rest_prep = 16000;
        }
        iVar6 = 10;
      }
    }
  }
  return iVar6;
}

Assistant:

static int borg_perma_aux(int what)
{

    /* Analyze */
    switch (what) {
    case BP_SPEED: {
        return (borg_perma_aux_speed());
    }

    case BP_PROT_FROM_EVIL: {
        return (borg_perma_aux_prot_evil());
    }
    case BP_RESIST_ALL: {
        return (borg_perma_aux_resist());
    }
    case BP_RESIST_ALL_COLLUIN: {
        return (borg_perma_aux_resist_colluin());
    }
    case BP_RESIST_P: {
        return (borg_perma_aux_resist_p());
    }
    case BP_BLESS: {
        return (borg_perma_aux_bless());
    }
    case BP_FASTCAST: {
        return (borg_perma_aux_fastcast());
    }
    case BP_HERO: {
        return (borg_perma_aux_hero());
    }
    case BP_BERSERK: {
        return (borg_perma_aux_berserk());
    }
    case BP_BERSERK_POTION: {
        return (borg_perma_aux_berserk_potion());
    }
    case BP_SMITE_EVIL: {
        return (borg_perma_aux_smite_evil());
    }
    case BP_VENOM: {
        return (borg_perma_aux_venom());
    }
    case BP_REGEN: {
        return (borg_perma_aux_regen());
    }
    case BP_GLYPH: {
        /* return (borg_perma_aux_glyph()); Tends to use too much mana doing
         * this */
        return 0;
    }
    case BP_SEE_INV: {
        return (borg_perma_aux_see_inv());
    }
    }
    return 0;
}